

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockNodeUpdateVisibleFlagAndInactiveChilds(ImGuiDockNode *node)

{
  ImVector<ImGuiWindow_*> *this;
  int iVar1;
  ImGuiDockNode *pIVar2;
  ImGuiWindow *window;
  bool bVar3;
  bool bVar4;
  ImGuiContext *pIVar5;
  uint uVar6;
  ImGuiWindow **ppIVar7;
  byte bVar8;
  byte bVar9;
  int i;
  byte bVar10;
  
  pIVar5 = GImGui;
  pIVar2 = node->ParentNode;
  if (pIVar2 != (ImGuiDockNode *)0x0) {
    if ((pIVar2->ChildNodes[0] != node) && (pIVar2->ChildNodes[1] != node)) {
      __assert_fail("node->ParentNode == __null || node->ParentNode->ChildNodes[0] == node || node->ParentNode->ChildNodes[1] == node"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x320d,
                    "void ImGui::DockNodeUpdateVisibleFlagAndInactiveChilds(ImGuiDockNode *)");
    }
    node->SharedFlags = pIVar2->SharedFlags;
  }
  if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
    DockNodeUpdateVisibleFlagAndInactiveChilds(node->ChildNodes[0]);
  }
  if (node->ChildNodes[1] != (ImGuiDockNode *)0x0) {
    DockNodeUpdateVisibleFlagAndInactiveChilds(node->ChildNodes[1]);
  }
  this = &node->Windows;
  i = 0;
  while (iVar1 = this->Size, i < iVar1) {
    ppIVar7 = ImVector<ImGuiWindow_*>::operator[](this,i);
    window = *ppIVar7;
    if (window->DockNode != node) {
      __assert_fail("window->DockNode == node",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x3221,
                    "void ImGui::DockNodeUpdateVisibleFlagAndInactiveChilds(ImGuiDockNode *)");
    }
    if (node->LastFrameActive + 1 == pIVar5->FrameCount) {
      bVar3 = window->LastFrameActive < node->LastFrameActive;
      if ((((node->field_0xb9 & 0x40) != 0) || (bVar4 = false, node->WantCloseTabId == window->ID))
         && (bVar4 = false, window->HasCloseButton == true)) {
        bVar4 = (window->Flags & 0x100000) == 0;
      }
    }
    else {
      bVar3 = false;
      bVar4 = false;
    }
    if ((bVar3 || bVar4) || ((byte)window->field_0x492 >> 2 & 1) != 0) {
      window->field_0x492 = window->field_0x492 & 0xfb;
      if ((this->Size == 1) && ((node->LocalFlags & 0x800) == 0)) {
        DockNodeHideHostWindow(node);
        node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
        DockNodeRemoveWindow(node,window,node->ID);
        return;
      }
      DockNodeRemoveWindow(node,window,node->ID);
    }
    else {
      node->LocalFlags =
           ~(window->WindowClass).DockNodeFlagsOverrideClear & node->LocalFlags |
           (window->WindowClass).DockNodeFlagsOverrideSet;
      i = i + 1;
    }
  }
  uVar6 = node->LocalFlags;
  bVar9 = node->field_0xba;
  bVar10 = bVar9;
  if ((bVar9 & 2) != 0) {
    bVar10 = bVar9 | 4;
    if (((node->SharedFlags | uVar6) & 0x40) == 0) {
      bVar10 = bVar9;
    }
    if ((uVar6 & 0x2000) != 0 || iVar1 != 1) {
      bVar10 = bVar9;
    }
  }
  bVar8 = bVar10 & 0xfd;
  node->field_0xba = bVar8;
  bVar9 = bVar8;
  if ((((bVar10 & 4) != 0) && (node->VisibleWindow != (ImGuiWindow *)0x0)) &&
     (bVar9 = bVar10 & 0xf9,
     ((node->VisibleWindow->WindowClass).DockNodeFlagsOverrideSet & 0x2000) == 0)) {
    bVar9 = bVar8;
  }
  if (iVar1 < 2) {
    if ((bVar9 & 4) == 0) goto LAB_0013a667;
    uVar6 = uVar6 ^ 0x2000;
  }
  else {
    uVar6 = uVar6 & 0xffffdfff;
  }
  node->LocalFlags = uVar6;
LAB_0013a667:
  node->field_0xba = bVar9 & 0xf9;
  DockNodeUpdateVisibleFlag(node);
  return;
}

Assistant:

static void ImGui::DockNodeUpdateVisibleFlagAndInactiveChilds(ImGuiDockNode* node)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(node->ParentNode == NULL || node->ParentNode->ChildNodes[0] == node || node->ParentNode->ChildNodes[1] == node);

    // Inherit most flags
    if (node->ParentNode)
        node->SharedFlags = node->ParentNode->SharedFlags & ImGuiDockNodeFlags_SharedFlagsInheritMask_;

    // Recurse into children
    // There is the possibility that one of our child becoming empty will delete itself and moving its sibling contents into 'node'.
    // If 'node->ChildNode[0]' delete itself, then 'node->ChildNode[1]->Windows' will be moved into 'node'
    // If 'node->ChildNode[1]' delete itself, then 'node->ChildNode[0]->Windows' will be moved into 'node' and the "remove inactive windows" loop will have run twice on those windows (harmless)
    if (node->ChildNodes[0])
        DockNodeUpdateVisibleFlagAndInactiveChilds(node->ChildNodes[0]);
    if (node->ChildNodes[1])
        DockNodeUpdateVisibleFlagAndInactiveChilds(node->ChildNodes[1]);

    // Remove inactive windows
    // Merge node flags overrides stored in windows
    for (int window_n = 0; window_n < node->Windows.Size; window_n++)
    {
        ImGuiWindow* window = node->Windows[window_n];
        IM_ASSERT(window->DockNode == node);

        bool node_was_active = (node->LastFrameActive + 1 == g.FrameCount);
        bool remove = false;
        remove |= node_was_active && (window->LastFrameActive + 1 < g.FrameCount);
        remove |= node_was_active && (node->WantCloseAll || node->WantCloseTabId == window->ID) && window->HasCloseButton && !(window->Flags & ImGuiWindowFlags_UnsavedDocument);  // Submit all _expected_ closure from last frame
        remove |= (window->DockTabWantClose);
        if (remove)
        {
            window->DockTabWantClose = false;
            if (node->Windows.Size == 1 && !node->IsCentralNode())
            {
                DockNodeHideHostWindow(node);
                node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
                DockNodeRemoveWindow(node, window, node->ID); // Will delete the node so it'll be invalid on return
                return;
            }
            DockNodeRemoveWindow(node, window, node->ID);
            window_n--;
        }
        else
        {
            node->LocalFlags &= ~window->WindowClass.DockNodeFlagsOverrideClear;
            node->LocalFlags |= window->WindowClass.DockNodeFlagsOverrideSet;
        }
    }

    // Auto-hide tab bar option
    ImGuiDockNodeFlags node_flags = node->GetMergedFlags();
    if (node->WantHiddenTabBarUpdate && node->Windows.Size == 1 && (node_flags & ImGuiDockNodeFlags_AutoHideTabBar) && !node->IsHiddenTabBar())
        node->WantHiddenTabBarToggle = true;
    node->WantHiddenTabBarUpdate = false;

    // Cancel toggling if we know our tab bar is enforced to be hidden at all times
    if (node->WantHiddenTabBarToggle && node->VisibleWindow && (node->VisibleWindow->WindowClass.DockNodeFlagsOverrideSet & ImGuiDockNodeFlags_HiddenTabBar))
        node->WantHiddenTabBarToggle = false;

    // Apply toggles at a single point of the frame (here!)
    if (node->Windows.Size > 1)
        node->LocalFlags &= ~ImGuiDockNodeFlags_HiddenTabBar;
    else if (node->WantHiddenTabBarToggle)
        node->LocalFlags ^= ImGuiDockNodeFlags_HiddenTabBar;
    node->WantHiddenTabBarToggle = false;

    DockNodeUpdateVisibleFlag(node);
}